

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O1

RESULT_TYPE __thiscall
duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
          (MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t> *this,
          INPUT_TYPE *input)

{
  int64_t delta_us;
  RESULT_TYPE RVar2;
  undefined1 auVar3 [12];
  int64_t iVar4;
  interval_t iVar1;
  
  delta_us = timestamp_t::operator-(input,this->median);
  if (delta_us < 1) {
    delta_us = -delta_us;
  }
  iVar1 = Interval::FromMicro(delta_us);
  RVar2.months = iVar1.months;
  auVar3._4_4_ = iVar1.days;
  register0x00000010 = iVar1.micros;
  return RVar2;
}

Assistant:

inline RESULT_TYPE operator()(const INPUT_TYPE &input) const {
		const auto delta = input - median;
		return Interval::FromMicro(TryAbsOperator::Operation<int64_t, int64_t>(delta));
	}